

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

void __thiscall Logger::~Logger(Logger *this)

{
  int len;
  LogStream *this_00;
  Buffer *this_01;
  char *msg;
  Logger *in_RDI;
  Buffer *buf;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  LogStream *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  LogStream *in_stack_ffffffffffffffc0;
  
  LogStream::operator<<
            (in_stack_ffffffffffffffb0,
             (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  LogStream::operator<<(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  LogStream::operator<<
            (in_stack_ffffffffffffffb0,
             (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  LogStream::operator<<(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  LogStream::operator<<(in_stack_ffffffffffffffb0,(char)((uint)in_stack_ffffffffffffffac >> 0x18));
  this_00 = stream(in_RDI);
  this_01 = LogStream::buffer(this_00);
  msg = FixedBuffer<4000>::data(this_01);
  len = FixedBuffer<4000>::length(this_01);
  output(msg,len);
  Impl::~Impl((Impl *)0x1208cf);
  return;
}

Assistant:

Logger::~Logger(){
    impl_.stream_<<" -- "<<impl_.basename_<<":"<<impl_.line_<<'\n';
    const LogStream::Buffer& buf(stream().buffer());
    output(buf.data(), buf.length());
}